

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int MRIStepGetCurrentCoupling(void *arkode_mem,MRIStepCoupling *MRIC)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"MRIStepGetCurrentCoupling",&local_10,&local_18);
  if (iVar1 == 0) {
    *MRIC = local_18->MRIC;
  }
  return iVar1;
}

Assistant:

int MRIStepGetCurrentCoupling(void* arkode_mem, MRIStepCoupling* MRIC)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* get coupling structure from step_mem */
  *MRIC = step_mem->MRIC;

  return (ARK_SUCCESS);
}